

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

QSize __thiscall
QProxyStyle::sizeFromContents
          (QProxyStyle *this,ContentsType type,QStyleOption *option,QSize *size,QWidget *widget)

{
  QProxyStylePrivate *pQVar1;
  QStyle *pQVar2;
  QSize QVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  QProxyStylePrivate *d;
  QProxyStylePrivate *in_stack_fffffffffffffff8;
  
  pQVar1 = d_func((QProxyStyle *)0x4090fa);
  QProxyStylePrivate::ensureBaseStyle(in_stack_fffffffffffffff8);
  pQVar2 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x409117);
  QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe8))
                           (pQVar2,in_ESI,in_RDX,in_RCX,in_R8,in_R9,pQVar1);
  return QVar3;
}

Assistant:

QSize QProxyStyle::sizeFromContents(ContentsType type, const QStyleOption *option, const QSize &size, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->sizeFromContents(type, option, size, widget);
}